

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O3

vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *
__thiscall
Assimp::FBX::Document::GetConnectionsSequenced
          (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *__return_storage_ptr__,Document *this,uint64_t id,bool is_src,ConnectionMap *conns,
          char **classnames,size_t count)

{
  Token *pTVar1;
  char *__s2;
  iterator __position;
  __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
  __first;
  __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
  __last;
  long lVar2;
  _Iter_comp_iter<std::_Mem_fn<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const>_>
  __comp;
  _Iter_comp_iter<std::_Mem_fn<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const>_>
  __comp_00;
  int iVar3;
  size_t sVar4;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_> _Var5;
  LazyObject *pLVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined7 in_register_00000009;
  size_t i;
  size_t sVar9;
  size_type __n;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  pVar10;
  size_t lengths [6];
  undefined4 in_stack_ffffffffffffff80;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_> local_78
  ;
  uint64_t local_70;
  size_t asStack_68 [7];
  
  uVar8 = (undefined4)CONCAT71(in_register_00000009,is_src);
  local_70 = id;
  if (classnames == (char **)0x0) {
    __assert_fail("classnames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.cpp"
                  ,0x241,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  if (count == 0) {
    __assert_fail("count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.cpp"
                  ,0x242,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  if (6 < count) {
    __assert_fail("count <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.cpp"
                  ,0x243,
                  "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                 );
  }
  sVar9 = 0;
  do {
    sVar4 = strlen(classnames[sVar9]);
    asStack_68[sVar9] = sVar4;
    sVar9 = sVar9 + 1;
  } while (count != sVar9);
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(pointer *)((long)__return_storage_ptr__ + 8) = (pointer)0x0;
  *(pointer *)((long)__return_storage_ptr__ + 0x10) = (pointer)0x0;
  pVar10 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
           ::equal_range(&conns->_M_t,&local_70);
  __n = 0;
  _Var5._M_node = pVar10.first._M_node._M_node;
  while (_Var5._M_node != pVar10.second._M_node._M_node) {
    _Var5._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var5._M_node);
    __n = __n + 1;
  }
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  reserve(__return_storage_ptr__,__n);
  if (pVar10.first._M_node._M_node != pVar10.second._M_node._M_node) {
    do {
      local_78 = pVar10.second._M_node;
      _Var5 = pVar10.first._M_node;
      if ((char)uVar8 == '\0') {
        pLVar6 = Connection::LazySourceObject((Connection *)_Var5._M_node[1]._M_parent);
      }
      else {
        pLVar6 = Connection::LazyDestinationObject((Connection *)_Var5._M_node[1]._M_parent);
      }
      pTVar1 = pLVar6->element->key_token;
      __s2 = pTVar1->sbegin;
      sVar9 = 0;
      do {
        if (classnames[sVar9] == (char *)0x0) {
          __assert_fail("classnames[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.cpp"
                        ,0x25a,
                        "std::vector<const Connection *> Assimp::FBX::Document::GetConnectionsSequenced(uint64_t, bool, const ConnectionMap &, const char *const *, size_t) const"
                       );
        }
        sVar4 = (long)pTVar1->send - (long)__s2;
        if ((sVar4 == asStack_68[sVar9]) &&
           (iVar3 = strncmp(classnames[sVar9],__s2,sVar4), iVar3 == 0)) goto LAB_00185194;
        sVar9 = sVar9 + 1;
      } while (count != sVar9);
      if (__s2 == (char *)0x0) {
LAB_00185194:
        __position._M_current = *(Connection ***)((long)__return_storage_ptr__ + 8);
        if (__position._M_current == *(Connection ***)((long)__return_storage_ptr__ + 0x10)) {
          std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>
          ::_M_realloc_insert<Assimp::FBX::Connection_const*const&>
                    ((vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>
                      *)__return_storage_ptr__,__position,(Connection **)&_Var5._M_node[1]._M_parent
                    );
        }
        else {
          *__position._M_current = (Connection *)_Var5._M_node[1]._M_parent;
          *(long *)((long)__return_storage_ptr__ + 8) =
               *(long *)((long)__return_storage_ptr__ + 8) + 8;
        }
      }
      _Var5._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var5._M_node);
      pVar10.second._M_node = local_78._M_node;
      pVar10.first._M_node = _Var5._M_node;
    } while (_Var5._M_node != local_78._M_node);
  }
  __first._M_current = *(Connection ***)__return_storage_ptr__;
  __last._M_current = *(Connection ***)((long)__return_storage_ptr__ + 8);
  if (__first._M_current != __last._M_current) {
    uVar7 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar2 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    __comp._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._8_4_ = in_stack_ffffffffffffff80;
    __comp._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._M_pmf = (offset_in_Connection_to_subr)__return_storage_ptr__;
    __comp._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._12_4_ = uVar8;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::FBX::Connection_const**,std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::_Mem_fn<bool(Assimp::FBX::Connection::*)(Assimp::FBX::Connection_const*)const>>>
              (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp);
    __comp_00._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._8_4_ = in_stack_ffffffffffffff80;
    __comp_00._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._M_pmf = (offset_in_Connection_to_subr)__return_storage_ptr__;
    __comp_00._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._12_4_ = uVar8;
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Assimp::FBX::Connection_const**,std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::_Mem_fn<bool(Assimp::FBX::Connection::*)(Assimp::FBX::Connection_const*)const>>>
              (__first,__last,__comp_00);
  }
  return (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          *)(vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>> *
            )__return_storage_ptr__;
}

Assistant:

std::vector<const Connection*> Document::GetConnectionsSequenced(uint64_t id, bool is_src,
    const ConnectionMap& conns,
    const char* const* classnames,
    size_t count) const

{
    ai_assert(classnames);
    ai_assert( count != 0 );
    ai_assert( count <= MAX_CLASSNAMES);

    size_t lengths[MAX_CLASSNAMES];

    const size_t c = count;
    for (size_t i = 0; i < c; ++i) {
        lengths[ i ] = strlen(classnames[i]);
    }

    std::vector<const Connection*> temp;
    const std::pair<ConnectionMap::const_iterator,ConnectionMap::const_iterator> range =
        conns.equal_range(id);

    temp.reserve(std::distance(range.first,range.second));
    for (ConnectionMap::const_iterator it = range.first; it != range.second; ++it) {
        const Token& key = (is_src
            ? (*it).second->LazyDestinationObject()
            : (*it).second->LazySourceObject()
        ).GetElement().KeyToken();

        const char* obtype = key.begin();

        for (size_t i = 0; i < c; ++i) {
            ai_assert(classnames[i]);
            if(static_cast<size_t>(std::distance(key.begin(),key.end())) == lengths[i] && !strncmp(classnames[i],obtype,lengths[i])) {
                obtype = nullptr;
                break;
            }
        }

        if(obtype) {
            continue;
        }

        temp.push_back((*it).second);
    }

    std::sort(temp.begin(), temp.end(), std::mem_fn(&Connection::Compare));
    return temp; // NRVO should handle this
}